

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorCreator.hpp
# Opt level: O2

Integrator * __thiscall
OpenMD::IntegratorBuilder<OpenMD::NPTxyz>::create
          (IntegratorBuilder<OpenMD::NPTxyz> *this,SimInfo *info)

{
  Integrator *this_00;
  
  this_00 = (Integrator *)operator_new(0x328);
  NPTxyz::NPTxyz((NPTxyz *)this_00,info);
  return this_00;
}

Assistant:

virtual Integrator* create(SimInfo* info) const {
      return new ConcreteIntegrator(info);
    }